

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

int __thiscall CServer::Run(CServer *this)

{
  CNetServer *this_00;
  uint uVar1;
  CConfig *pCVar2;
  IKernel *pIVar3;
  IConsole *pConsole;
  byte bVar4;
  NETADDR_conflict BindAddr;
  bool bVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  int64 iVar8;
  int64 iVar9;
  int64 iVar10;
  CInput *pCVar11;
  long lVar12;
  int c_1;
  long lVar13;
  int c;
  ulong uVar14;
  CClient *this_01;
  CInput *pCVar15;
  long in_FS_OFFSET;
  bool aSpecs [64];
  char aBuf [256];
  byte abStack_1a8 [64];
  char local_168 [256];
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  uchar auStack_5c [4];
  undefined8 local_58;
  NETADDR local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x17])
                    (this->m_pConsole,(ulong)(uint)this->m_pConfig->m_ConsoleOutputLevel,
                     SendRconLineAuthed,this);
  this->m_PrintCBIndex = iVar6;
  InitMapList(this);
  iVar6 = LoadMap(this,this->m_pConfig->m_SvMap);
  pCVar2 = this->m_pConfig;
  if (iVar6 == 0) {
    dbg_msg("server","failed to load map. mapname=\'%s\'",pCVar2->m_SvMap);
  }
  else {
    this->m_MapChunksPerRequest = pCVar2->m_SvMapDownloadSpeed;
    if ((pCVar2->m_Bindaddr[0] == '\0') ||
       (iVar6 = net_host_lookup(pCVar2->m_Bindaddr,&local_50,3), iVar6 != 0)) {
      mem_zero(&local_50,0x18);
    }
    local_50.type = 3;
    local_50.port = (unsigned_short)this->m_pConfig->m_SvPort;
    this_00 = &this->m_NetServer;
    local_68 = 3;
    uStack_64 = local_50.ip._0_4_;
    uStack_60 = local_50.ip._4_4_;
    auStack_5c[0] = local_50.ip[8];
    auStack_5c[1] = local_50.ip[9];
    auStack_5c[2] = local_50.ip[10];
    auStack_5c[3] = local_50.ip[0xb];
    local_58 = CONCAT26(local_50.reserved,CONCAT24(local_50.port,local_50.ip._12_4_));
    pIVar3 = (this->super_IServer).super_IInterface.m_pKernel;
    pCVar2 = this->m_pConfig;
    pConsole = this->m_pConsole;
    iVar6 = (*pIVar3->_vptr_IKernel[2])(pIVar3,"engine");
    BindAddr.ip[0] = (undefined1)uStack_64;
    BindAddr.ip[1] = uStack_64._1_1_;
    BindAddr.ip[2] = uStack_64._2_1_;
    BindAddr.ip[3] = uStack_64._3_1_;
    BindAddr.type = local_68;
    BindAddr.ip[8] = auStack_5c[0];
    BindAddr.ip[9] = auStack_5c[1];
    BindAddr.ip[10] = auStack_5c[2];
    BindAddr.ip[0xb] = auStack_5c[3];
    BindAddr.ip[4] = (undefined1)uStack_60;
    BindAddr.ip[5] = uStack_60._1_1_;
    BindAddr.ip[6] = uStack_60._2_1_;
    BindAddr.ip[7] = uStack_60._3_1_;
    BindAddr.ip[0xc] = (undefined1)local_58;
    BindAddr.ip[0xd] = local_58._1_1_;
    BindAddr.ip[0xe] = local_58._2_1_;
    BindAddr.ip[0xf] = local_58._3_1_;
    BindAddr.port = local_58._4_2_;
    BindAddr.reserved = local_58._6_2_;
    bVar5 = CNetServer::Open(this_00,BindAddr,pCVar2,pConsole,
                             (IEngine *)CONCAT44(extraout_var,iVar6),
                             &(this->m_ServerBan).super_CNetBan,this->m_pConfig->m_SvMaxClients,
                             this->m_pConfig->m_SvMaxClientsPerIP,NewClientCallback,
                             DelClientCallback,this);
    if (bVar5) {
      CEcon::Init(&this->m_Econ,this->m_pConfig,this->m_pConsole,&(this->m_ServerBan).super_CNetBan)
      ;
      str_format(local_168,0x100,"server name is \'%s\'",this->m_pConfig->m_SvName);
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,0,"server",local_168,0);
      (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[2])();
      iVar6 = (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[0x15])();
      str_format(local_168,0x100,"netversion %s",CONCAT44(extraout_var_00,iVar6));
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,0,"server",local_168,0);
      iVar6 = (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[0x16])();
      iVar7 = (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[0x17])();
      iVar6 = str_comp((char *)CONCAT44(extraout_var_01,iVar6),
                       (char *)CONCAT44(extraout_var_02,iVar7));
      if (iVar6 != 0) {
        (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                  (this->m_pConsole,0,"server","WARNING: netversion hash differs",0);
      }
      iVar6 = (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[0x14])();
      str_format(local_168,0x100,"game version %s",CONCAT44(extraout_var_03,iVar6));
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,0,"server",local_168,0);
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x10])(this->m_pConsole,0);
      if (this->m_GeneratedRconPassword != 0) {
        dbg_msg("server","+-------------------------+");
        dbg_msg("server","| rcon password: \'%s\' |",this->m_pConfig->m_SvRconPassword);
        dbg_msg("server","+-------------------------+");
      }
      iVar8 = time_get();
      this->m_GameStartTime = iVar8;
      do {
        if (this->m_RunServer != true) goto LAB_0011476c;
        if ((this->m_MapReload != false) || (0x6ffffffe < (this->super_IServer).m_CurrentGameTick))
        {
          this->m_MapReload = false;
          iVar6 = LoadMap(this,this->m_pConfig->m_SvMap);
          if (iVar6 == 0) {
            str_format(local_168,0x100,"failed to load map. mapname=\'%s\'",this->m_pConfig->m_SvMap
                      );
            (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                      (this->m_pConsole,0,"server",local_168,0);
            str_copy(this->m_pConfig->m_SvMap,this->m_aCurrentMap,0x80);
          }
          else {
            uVar14 = 0;
            do {
              iVar6 = (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[0x12])
                                (this->m_pGameServer,uVar14 & 0xffffffff);
              abStack_1a8[uVar14] = (byte)iVar6;
              uVar14 = uVar14 + 1;
            } while (uVar14 != 0x40);
            (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[4])();
            lVar13 = 0;
            this_01 = this->m_aClients;
            do {
              if (1 < this_01->m_State) {
                SendMap(this,(int)lVar13);
                CClient::Reset(this_01);
                this_01->m_State = abStack_1a8[lVar13] | 2;
              }
              lVar13 = lVar13 + 1;
              this_01 = this_01 + 1;
            } while (lVar13 != 0x40);
            iVar8 = time_get();
            this->m_GameStartTime = iVar8;
            (this->super_IServer).m_CurrentGameTick = 0;
            pIVar3 = (this->super_IServer).super_IInterface.m_pKernel;
            (*pIVar3->_vptr_IKernel[1])(pIVar3,"gameserver",this->m_pGameServer);
            (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[2])();
          }
        }
        iVar8 = time_get();
        iVar6 = (this->super_IServer).m_CurrentGameTick;
        lVar13 = this->m_GameStartTime;
        iVar9 = time_freq();
        lVar13 = (iVar9 * ((long)iVar6 + 1)) / 0x32 + lVar13;
        if (lVar13 < iVar8) {
          bVar4 = 0;
          do {
            uVar1 = (this->super_IServer).m_CurrentGameTick;
            (this->super_IServer).m_CurrentGameTick = uVar1 + 1;
            uVar14 = 0;
            pCVar15 = this->m_aClients[0].m_aInputs;
            do {
              iVar6 = this->m_aClients[uVar14].m_State;
              if (iVar6 != 0) {
                lVar12 = 200;
                pCVar11 = pCVar15;
                do {
                  if (pCVar11->m_GameTick == (this->super_IServer).m_CurrentGameTick) {
                    if (iVar6 == 5) {
                      (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[0xe])
                                (this->m_pGameServer,uVar14 & 0xffffffff);
                    }
                    break;
                  }
                  pCVar11 = pCVar11 + 1;
                  lVar12 = lVar12 + -1;
                } while (lVar12 != 0);
              }
              uVar14 = uVar14 + 1;
              pCVar15 = (CInput *)((long)(pCVar15 + 0xc9) + 0xcc);
            } while (uVar14 != 0x40);
            if ((uVar1 & 1) != 0) {
              bVar4 = 1;
            }
            (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[5])();
            iVar6 = (this->super_IServer).m_CurrentGameTick;
            lVar12 = this->m_GameStartTime;
            iVar9 = time_freq();
          } while ((iVar9 * ((long)iVar6 + 1)) / 0x32 + lVar12 < iVar8);
        }
        else {
          bVar4 = 0;
        }
        if (lVar13 < iVar8) {
          if ((bool)(this->m_pConfig->m_SvHighBandwidth != 0 | bVar4)) {
            DoSnapshot(this);
          }
          UpdateClientRconCommands(this);
          UpdateClientMapListEntries(this);
        }
        CRegister::RegisterUpdate
                  (&this->m_Register,(this->m_NetServer).super_CNetBase.m_Socket.type);
        PumpNetwork(this);
        iVar6 = (this->super_IServer).m_CurrentGameTick;
        lVar13 = this->m_GameStartTime;
        iVar8 = time_freq();
        iVar9 = time_get();
        iVar10 = time_freq();
        iVar6 = (int)((((lVar13 - iVar9) + (iVar8 * ((long)iVar6 + 1)) / 0x32) * 1000) / iVar10);
        if (9 < iVar6) {
          iVar6 = 10;
        }
        if (iVar6 < 2) {
          iVar6 = 1;
        }
        CNetBase::Wait(&this_00->super_CNetBase,iVar6);
      } while (InterruptSignaled == 0);
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,0,"server","interrupted",0);
LAB_0011476c:
      CNetServer::Close(this_00,this->m_aShutdownReason);
      CEcon::Shutdown(&this->m_Econ);
      (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[4])();
      Free(this);
      iVar6 = 0;
      goto LAB_001147e5;
    }
    dbg_msg("server","couldn\'t open socket. port %d might already be in use",
            (ulong)(uint)this->m_pConfig->m_SvPort);
  }
  Free(this);
  iVar6 = -1;
LAB_001147e5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

int CServer::Run()
{
	//
	m_PrintCBIndex = Console()->RegisterPrintCallback(Config()->m_ConsoleOutputLevel, SendRconLineAuthed, this);

	InitMapList();

	// load map
	if(!LoadMap(Config()->m_SvMap))
	{
		dbg_msg("server", "failed to load map. mapname='%s'", Config()->m_SvMap);
		Free();
		return -1;
	}
	m_MapChunksPerRequest = Config()->m_SvMapDownloadSpeed;

	// start server
	NETADDR BindAddr;
	if(Config()->m_Bindaddr[0] && net_host_lookup(Config()->m_Bindaddr, &BindAddr, NETTYPE_ALL) == 0)
	{
		// sweet!
		BindAddr.type = NETTYPE_ALL;
		BindAddr.port = Config()->m_SvPort;
	}
	else
	{
		mem_zero(&BindAddr, sizeof(BindAddr));
		BindAddr.type = NETTYPE_ALL;
		BindAddr.port = Config()->m_SvPort;
	}

	if(!m_NetServer.Open(BindAddr, Config(), Console(), Kernel()->RequestInterface<IEngine>(), &m_ServerBan,
		Config()->m_SvMaxClients, Config()->m_SvMaxClientsPerIP, NewClientCallback, DelClientCallback, this))
	{
		dbg_msg("server", "couldn't open socket. port %d might already be in use", Config()->m_SvPort);
		Free();
		return -1;
	}

	m_Econ.Init(Config(), Console(), &m_ServerBan);

	char aBuf[256];
	str_format(aBuf, sizeof(aBuf), "server name is '%s'", Config()->m_SvName);
	Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", aBuf);

	GameServer()->OnInit();
	str_format(aBuf, sizeof(aBuf), "netversion %s", GameServer()->NetVersion());
	Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", aBuf);
	if(str_comp(GameServer()->NetVersionHashUsed(), GameServer()->NetVersionHashReal()))
	{
		m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", "WARNING: netversion hash differs");
	}
	str_format(aBuf, sizeof(aBuf), "game version %s", GameServer()->Version());
	Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", aBuf);

	// process pending commands
	m_pConsole->StoreCommands(false);

	if(m_GeneratedRconPassword)
	{
		dbg_msg("server", "+-------------------------+");
		dbg_msg("server", "| rcon password: '%s' |", Config()->m_SvRconPassword);
		dbg_msg("server", "+-------------------------+");
	}

	// start game
	{
		m_GameStartTime = time_get();

		while(m_RunServer)
		{
			// load new map
			if(m_MapReload || m_CurrentGameTick >= 0x6FFFFFFF) //	force reload to make sure the ticks stay within a valid range
			{
				m_MapReload = false;

				// load map
				if(LoadMap(Config()->m_SvMap))
				{
					// new map loaded
					bool aSpecs[MAX_CLIENTS];
					for(int c = 0; c < MAX_CLIENTS; c++)
						aSpecs[c] = GameServer()->IsClientSpectator(c);

					GameServer()->OnShutdown();

					for(int c = 0; c < MAX_CLIENTS; c++)
					{
						if(m_aClients[c].m_State <= CClient::STATE_AUTH)
							continue;

						SendMap(c);
						m_aClients[c].Reset();
						m_aClients[c].m_State = aSpecs[c] ? CClient::STATE_CONNECTING_AS_SPEC : CClient::STATE_CONNECTING;
					}

					m_GameStartTime = time_get();
					m_CurrentGameTick = 0;
					Kernel()->ReregisterInterface(GameServer());
					GameServer()->OnInit();
				}
				else
				{
					str_format(aBuf, sizeof(aBuf), "failed to load map. mapname='%s'", Config()->m_SvMap);
					Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", aBuf);
					str_copy(Config()->m_SvMap, m_aCurrentMap, sizeof(Config()->m_SvMap));
				}
			}

			int64 Now = time_get();
			bool NewTicks = false;
			bool ShouldSnap = false;
			while(Now > TickStartTime(m_CurrentGameTick+1))
			{
				m_CurrentGameTick++;
				NewTicks = true;
				if((m_CurrentGameTick%2) == 0)
					ShouldSnap = true;

				// apply new input
				for(int c = 0; c < MAX_CLIENTS; c++)
				{
					if(m_aClients[c].m_State == CClient::STATE_EMPTY)
						continue;
					for(int i = 0; i < 200; i++)
					{
						if(m_aClients[c].m_aInputs[i].m_GameTick == Tick())
						{
							if(m_aClients[c].m_State == CClient::STATE_INGAME)
								GameServer()->OnClientPredictedInput(c, m_aClients[c].m_aInputs[i].m_aData);
							break;
						}
					}
				}

				GameServer()->OnTick();
			}

			// snap game
			if(NewTicks)
			{
				if(Config()->m_SvHighBandwidth || ShouldSnap)
					DoSnapshot();

				UpdateClientRconCommands();
				UpdateClientMapListEntries();
			}

			// master server stuff
			m_Register.RegisterUpdate(m_NetServer.NetType());

			PumpNetwork();

			// wait for incoming data
			m_NetServer.Wait(clamp(int((TickStartTime(m_CurrentGameTick+1)-time_get())*1000/time_freq()), 1, 1000/SERVER_TICK_SPEED/2));

			if(InterruptSignaled)
			{
				Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", "interrupted");
				break;
			}
		}
	}
	// disconnect all clients on shutdown
	m_NetServer.Close(m_aShutdownReason);
	m_Econ.Shutdown();

	GameServer()->OnShutdown();
	Free();

	return 0;
}